

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O2

cbtDbvtNode * __thiscall cbtDbvt::insert(cbtDbvt *this,cbtDbvtVolume *volume,void *data)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  cbtDbvtNode *leaf;
  
  leaf = createnode(this,(cbtDbvtNode *)0x0,data);
  uVar1 = *(undefined8 *)((volume->mi).m_floats + 2);
  uVar2 = *(undefined8 *)(volume->mx).m_floats;
  uVar3 = *(undefined8 *)((volume->mx).m_floats + 2);
  *(undefined8 *)(leaf->volume).mi.m_floats = *(undefined8 *)(volume->mi).m_floats;
  *(undefined8 *)((leaf->volume).mi.m_floats + 2) = uVar1;
  *(undefined8 *)(leaf->volume).mx.m_floats = uVar2;
  *(undefined8 *)((leaf->volume).mx.m_floats + 2) = uVar3;
  insertleaf(this,this->m_root,leaf);
  this->m_leaves = this->m_leaves + 1;
  return leaf;
}

Assistant:

cbtDbvtNode* cbtDbvt::insert(const cbtDbvtVolume& volume, void* data)
{
	cbtDbvtNode* leaf = createnode(this, 0, volume, data);
	insertleaf(this, m_root, leaf);
	++m_leaves;
	return (leaf);
}